

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

int __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ElementCompare::operator()(ElementCompare *this,Element *e1,Element *e2)

{
  bool bVar1;
  type_conflict5 tVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  Element *pEVar6;
  uint *puVar7;
  uint *puVar8;
  uint local_190 [28];
  int local_120;
  undefined1 local_11c;
  undefined8 local_118;
  uint local_110 [28];
  int local_a0;
  undefined1 local_9c;
  undefined8 local_98;
  uint local_90 [28];
  int local_20;
  undefined1 local_1c;
  undefined8 local_18;
  
  lVar5 = 0x1c;
  pEVar6 = e1;
  puVar7 = local_90;
  for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar7 = (pEVar6->val).m_backend.data._M_elems[0];
    pEVar6 = (Element *)((pEVar6->val).m_backend.data._M_elems + 1);
    puVar7 = puVar7 + 1;
  }
  local_20 = (e1->val).m_backend.exp;
  local_1c = (e1->val).m_backend.neg;
  local_18._0_4_ = (e1->val).m_backend.fpclass;
  local_18._4_4_ = (e1->val).m_backend.prec_elem;
  pEVar6 = e2;
  puVar7 = local_110;
  for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar7 = (pEVar6->val).m_backend.data._M_elems[0];
    pEVar6 = (Element *)((pEVar6->val).m_backend.data._M_elems + 1);
    puVar7 = puVar7 + 1;
  }
  local_a0 = (e2->val).m_backend.exp;
  local_9c = (e2->val).m_backend.neg;
  local_98._0_4_ = (e2->val).m_backend.fpclass;
  local_98._4_4_ = (e2->val).m_backend.prec_elem;
  puVar7 = (uint *)this;
  puVar8 = local_190;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar8 = puVar8 + 1;
  }
  local_120 = (this->epsiloncompare).m_backend.exp;
  local_11c = (this->epsiloncompare).m_backend.neg;
  local_118._0_4_ = (this->epsiloncompare).m_backend.fpclass;
  local_118._4_4_ = (this->epsiloncompare).m_backend.prec_elem;
  bVar1 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_90,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_110,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_190);
  uVar3 = 0;
  if (!bVar1) {
    tVar2 = boost::multiprecision::operator<(&e1->val,&e2->val);
    uVar3 = -(uint)tVar2 | 1;
  }
  return uVar3;
}

Assistant:

int operator()(const typename SVectorBase<R>::Element& e1,
                     const typename SVectorBase<R>::Element& e2) const
      {
         if(EQ(e1.val, e2.val, this->epsiloncompare))
            return 0;

         if(e1.val < e2.val)
            return -1;
         else // (e1.val > e2.val)
            return 1;
      }